

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-list.c
# Opt level: O2

void test_list_empty(void)

{
  LIST_NODE **ppLVar1;
  LIST_NODE node;
  LIST list;
  
  list.main.p = &list.main;
  list.main.n = &list.main;
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x3b,"%s","list_is_empty(&list)");
  node.p = list.main.p;
  ppLVar1 = &(list.main.p)->n;
  node.n = &list.main;
  list.main.p = &node;
  *ppLVar1 = &node;
  acutest_check_((uint)(list.main.n != &list.main),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x3d,"%s","!list_is_empty(&list)");
  return;
}

Assistant:

static void
test_list_empty(void)
{
    LIST list;
    LIST_NODE node;

    list_init(&list);

    TEST_CHECK(list_is_empty(&list));
    list_append(&list, &node);
    TEST_CHECK(!list_is_empty(&list));
}